

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# proitems.h
# Opt level: O0

bool __thiscall ProString::startsWith(ProString *this,QString *sub,CaseSensitivity cs)

{
  long lVar1;
  bool bVar2;
  undefined4 in_EDX;
  QStringView *in_RSI;
  QStringView *in_RDI;
  long in_FS_OFFSET;
  QStringView QVar3;
  undefined4 in_stack_ffffffffffffff98;
  QStringView *this_00;
  QStringView *n;
  qsizetype in_stack_ffffffffffffffb8;
  storage_type_conflict *psVar4;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = in_RDI;
  n = in_RDI;
  QStringView::QStringView<QString,_true>
            (in_RSI,(QString *)CONCAT44(in_EDX,in_stack_ffffffffffffff98));
  QVar3 = QStringView::mid(this_00,in_stack_ffffffffffffffb8,(qsizetype)n);
  psVar4 = (storage_type_conflict *)QVar3.m_size;
  QStringView::QStringView<QString,_true>
            (in_RSI,(QString *)CONCAT44(in_EDX,in_stack_ffffffffffffff98));
  QVar3.m_data = psVar4;
  QVar3.m_size = (qsizetype)n;
  bVar2 = QStringView::startsWith(in_RDI,QVar3,CaseInsensitive);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return bVar2;
  }
  __stack_chk_fail();
}

Assistant:

bool startsWith(const QString &sub, Qt::CaseSensitivity cs = Qt::CaseSensitive) const { return toQStringView().startsWith(sub, cs); }